

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ParseFrameworkMappings(ImportWriter *this)

{
  bool bVar1;
  ostream *poVar2;
  string parse_error;
  ProtoFrameworkCollector collector;
  string local_40;
  LineConsumer local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  
  this->need_to_parse_mapping_file_ = false;
  if ((this->named_framework_to_proto_path_mappings_path_)._M_string_length != 0) {
    local_18 = &this->proto_file_to_framework_name_;
    local_20._vptr_LineConsumer = (_func_int **)&PTR__LineConsumer_00426ce0;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    bVar1 = ParseSimpleFile(&this->named_framework_to_proto_path_mappings_path_,&local_20,&local_40)
    ;
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error parsing ",0xe)
      ;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,
                          (this->named_framework_to_proto_path_mappings_path_)._M_dataplus._M_p,
                          (this->named_framework_to_proto_path_mappings_path_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_40._M_dataplus._M_p,local_40._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void ImportWriter::ParseFrameworkMappings() {
  need_to_parse_mapping_file_ = false;
  if (named_framework_to_proto_path_mappings_path_.empty()) {
    return;  // Nothing to do.
  }

  ProtoFrameworkCollector collector(&proto_file_to_framework_name_);
  string parse_error;
  if (!ParseSimpleFile(named_framework_to_proto_path_mappings_path_,
                       &collector, &parse_error)) {
    cerr << "error parsing " << named_framework_to_proto_path_mappings_path_
         << " : " << parse_error << endl;
    cerr.flush();
  }
}